

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O1

void * luaM_shrinkvector_(lua_State *L,void *block,int *size,int final_n,uint size_elem)

{
  void *pvVar1;
  
  pvVar1 = luaM_saferealloc_(L,block,(long)*size * (ulong)size_elem,(ulong)size_elem * (long)final_n
                            );
  *size = final_n;
  return pvVar1;
}

Assistant:

void *luaM_shrinkvector_ (lua_State *L, void *block, int *size,
                          int final_n, unsigned size_elem) {
  void *newblock;
  size_t oldsize = cast_sizet(*size) * size_elem;
  size_t newsize = cast_sizet(final_n) * size_elem;
  lua_assert(newsize <= oldsize);
  newblock = luaM_saferealloc_(L, block, oldsize, newsize);
  *size = final_n;
  return newblock;
}